

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gedung.h
# Opt level: O3

void __thiscall Jalan::print(Jalan *this,FrameBuffer *fb)

{
  blok *pbVar1;
  bengkok *pbVar2;
  long lVar3;
  long lVar4;
  
  pbVar1 = this->jalanparkiran;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanparkiranbelakang;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanparkirankekiri;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanparkirankekanan;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar2 = this->jalanujungkiribelakang;
  if (0 < (pbVar2->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar2->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar2->super_Shape).size);
  }
  pbVar2 = this->jalanujungkiri;
  if (0 < (pbVar2->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar2->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar2->super_Shape).size);
  }
  pbVar2 = this->jalanujungkanan;
  if (0 < (pbVar2->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar2->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar2->super_Shape).size);
  }
  pbVar1 = this->jalankirigku;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanboulevard;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanboulevard1;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanboulevard2;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanboulevard3;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanboulevard4;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanintel;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanmesinmatik;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalangkumesin;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalangkutokema;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalantaman;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansunken;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalanseblabtek;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansetlabtek;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansebperpus;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansebgang1;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansebgang2;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->jalansebgang3;
  if (0 < (pbVar1->super_Shape).size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x50;
    } while (lVar4 < (pbVar1->super_Shape).size);
  }
  pbVar1 = this->gangkanan;
  if (0 < (pbVar1->super_Shape).size) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      Polygon::print((FrameBuffer *)((pbVar1->super_Shape).polygons + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x50;
    } while (lVar3 < (pbVar1->super_Shape).size);
  }
  return;
}

Assistant:

void print(FrameBuffer& fb){
    jalanparkiran->print(fb);
    jalanparkiranbelakang->print(fb);
    jalanparkirankekiri->print(fb);
    jalanparkirankekanan->print(fb);
    jalanujungkiribelakang->print(fb);
    jalanujungkiri->print(fb);
    jalanujungkanan->print(fb);
    jalankirigku->print(fb);
    jalanboulevard->print(fb);
    jalanboulevard1->print(fb);
    jalanboulevard2->print(fb);
    jalanboulevard3->print(fb);
    jalanboulevard4->print(fb);
    jalanintel->print(fb);
    jalanmesinmatik->print(fb);
    jalangkumesin->print(fb);
    jalangkutokema->print(fb);
    jalantaman->print(fb);
    jalansunken->print(fb);
    jalanseblabtek->print(fb);
    jalansetlabtek->print(fb);
    jalansebperpus->print(fb);
    jalansebgang1->print(fb);
    jalansebgang2->print(fb);
    jalansebgang3->print(fb);
    gangkanan->print(fb);
  }